

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall
tetgenmesh::sremovevertex(tetgenmesh *this,point delpt,face *parentsh,face *parentseg,int lawson)

{
  uint *puVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  shellface ppdVar5;
  char *pcVar6;
  undefined8 *puVar7;
  memorypool *pmVar8;
  char *pcVar9;
  char **ppcVar10;
  face *pfVar11;
  long lVar12;
  arraypool *paVar13;
  uint uVar14;
  shellface *pppdVar15;
  undefined8 *puVar16;
  shellface *pppdVar17;
  ulong uVar18;
  shellface ppdVar19;
  ulong uVar20;
  long lVar21;
  int *piVar22;
  int *in_R9;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  face *s;
  long lVar26;
  shellface *pppdVar27;
  uint uVar28;
  tetgenmesh *this_00;
  double dVar29;
  face abseg;
  shellface *local_110;
  shellface *local_108;
  int local_fc;
  tetgenmesh *local_f8;
  shellface local_f0;
  face *local_e8;
  shellface local_e0;
  shellface local_d8;
  shellface *local_d0;
  face local_c8;
  shellface *local_b8;
  uint local_b0;
  shellface local_98;
  undefined4 local_90;
  shellface local_80;
  undefined8 *local_78;
  shellface local_70;
  int local_64;
  face local_60;
  undefined8 *local_50;
  face *local_48;
  face local_40;
  
  lVar12 = 0;
  do {
    *(undefined8 *)((long)&local_c8.sh + lVar12) = 0;
    *(undefined4 *)((long)&local_c8.shver + lVar12) = 0;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x40);
  local_fc = lawson;
  local_f8 = this;
  local_f0 = (shellface)delpt;
  if (parentseg == (face *)0x0) {
    if (2 < this->b->verbose) {
      printf("      Remove vertex %d from surface.\n",
             (ulong)*(uint *)((long)delpt + (long)this->pointmarkindex * 4));
    }
    parentsh->shver = snextpivot[parentsh->shver];
    arraypool::newindex(this->cavesegshlist,&local_110);
    *local_110 = (shellface)parentsh->sh;
    *(int *)(local_110 + 1) = parentsh->shver;
    this_00 = local_f8;
  }
  else {
    local_40.sh = (shellface *)0x0;
    local_40.shver = 0;
    local_60.sh = (shellface *)0x0;
    local_60.shver = 0;
    local_50 = (undefined8 *)
               ((ulong)parentseg->sh[snextpivot[snextpivot[parentseg->shver]] >> 1] &
               0xfffffffffffffff8);
    ppdVar19 = (shellface)local_50[sorgpivot[0]];
    ppdVar5 = parentseg->sh[sdestpivot[parentseg->shver]];
    if (2 < this->b->verbose) {
      lVar12 = (long)this->pointmarkindex;
      printf("      Remove vertex %d from segment [%d, %d].\n",
             (ulong)*(uint *)((long)delpt + lVar12 * 4),
             (ulong)*(uint *)((long)ppdVar19 + lVar12 * 4),
             (ulong)*(uint *)((long)ppdVar5 + lVar12 * 4));
    }
    local_e0 = ppdVar19;
    makeshellface(this,this->subsegs,&local_40);
    local_64 = local_40.shver;
    uVar23 = (ulong)local_40.shver;
    local_40.sh[sorgpivot[uVar23]] = local_e0;
    local_40.sh[sdestpivot[uVar23]] = ppdVar5;
    local_40.sh[sapexpivot[uVar23]] = (shellface)0x0;
    pppdVar17 = parentseg->sh;
    *(undefined4 *)((long)local_40.sh + (long)this->shmarkindex * 4) =
         *(undefined4 *)((long)pppdVar17 + (long)this->shmarkindex * 4);
    if (this->checkconstraints != 0) {
      local_40.sh[this->areaboundindex] = pppdVar17[this->areaboundindex];
    }
    if (this->useinsertradius != 0) {
      *(undefined4 *)((long)local_40.sh + (long)this->shmarkindex * 4 + 8) =
           *(undefined4 *)((long)pppdVar17 + (long)this->shmarkindex * 4 + 8);
    }
    local_108 = local_40.sh;
    uVar18 = (ulong)snextpivot[0];
    iVar25 = snextpivot[uVar18];
    lVar12 = (long)(iVar25 >> 1);
    uVar20 = local_50[lVar12] & 0xfffffffffffffff8;
    if (uVar20 != 0) {
      iVar3 = snextpivot[snextpivot[uVar23]];
      *(ulong *)(uVar20 + (long)(snextpivot[0] >> 1) * 8) = (long)iVar3 | (ulong)local_40.sh;
      local_40.sh[iVar3 >> 1] = (shellface)(uVar20 | uVar18);
      pppdVar17 = parentseg->sh;
    }
    iVar3 = parentseg->shver;
    uVar18 = (ulong)pppdVar17[snextpivot[iVar3] >> 1] & 0xfffffffffffffff8;
    if (uVar18 != 0) {
      iVar4 = snextpivot[uVar23];
      *(ulong *)(uVar18 + lVar12 * 8) = (long)iVar4 | (ulong)local_40.sh;
      local_40.sh[iVar4 >> 1] = (shellface)((long)iVar25 | uVar18);
    }
    local_e8 = (face *)(uVar23 | (ulong)local_40.sh);
    iVar25 = this->point2simindex;
    local_e0[(long)iVar25 + 2] = (double *)local_e8;
    ppdVar5[(long)iVar25 + 2] = (double *)local_e8;
    pppdVar17 = parentseg->sh;
    ppdVar19 = pppdVar17[iVar3 >> 1];
    uVar28 = (uint)ppdVar19 & 7;
    parentsh->shver = uVar28;
    pppdVar15 = (shellface *)((ulong)ppdVar19 & 0xfffffffffffffff8);
    parentsh->sh = pppdVar15;
    local_80 = ppdVar5;
    local_48 = parentseg;
    if (pppdVar15 != (shellface *)0x0) {
      do {
        arraypool::newindex(local_f8->caveshlist,&local_110);
        *local_110 = (shellface)pppdVar15;
        *(uint *)(local_110 + 1) = uVar28;
        pppdVar27 = pppdVar15 + (uVar28 >> 1);
        pppdVar15 = (shellface *)((ulong)*pppdVar27 & 0xfffffffffffffff8);
        pppdVar17 = local_110;
        if (pppdVar15 == (shellface *)0x0) break;
        uVar28 = (uint)*pppdVar27 & 7;
      } while (parentsh->sh != pppdVar15);
    }
    in_R9 = (int *)0x0;
    this_00 = local_f8;
    while (paVar13 = this_00->caveshlist, (long)in_R9 < paVar13->objects) {
      pcVar6 = paVar13->toparray[(uint)in_R9 >> ((byte)paVar13->log2objectsperblock & 0x1f)];
      lVar12 = (long)paVar13->objectbytes * (long)(int)(paVar13->objectsperblockmark & (uint)in_R9);
      local_110 = (shellface *)(pcVar6 + lVar12);
      puVar7 = *(undefined8 **)(pcVar6 + lVar12);
      uVar28 = *(uint *)(pcVar6 + lVar12 + 8);
      uVar24 = (shellface)puVar7[sorgpivot[(int)uVar28]] != local_f0 ^ uVar28;
      puVar16 = puVar7;
      uVar14 = uVar24;
      while( true ) {
        iVar25 = snextpivot[snextpivot[(int)uVar14]];
        lVar12 = (long)(iVar25 >> 1);
        if (7 < (ulong)puVar16[lVar12 + 6]) break;
        uVar14 = (uint)puVar16[lVar12] & 7;
        puVar16 = (undefined8 *)(puVar16[lVar12] & 0xfffffffffffffff8);
        uVar14 = (shellface)puVar16[sorgpivot[uVar14]] != local_f0 ^ uVar14;
      }
      local_d0 = (shellface *)in_R9;
      if (puVar16 == puVar7) {
        uVar28 = (uint)puVar16[snextpivot[snextpivot[iVar25]] >> 1];
        local_60.shver = uVar28 & 7;
        local_60.sh = (shellface *)
                      (puVar16[snextpivot[snextpivot[iVar25]] >> 1] & 0xfffffffffffffff8);
        local_60.shver =
             (uint)(local_60.sh[sorgpivot[(uint)local_60.shver]] != local_e0) ^ local_60.shver;
        uVar23 = (ulong)(uVar28 & 6);
        *(undefined8 *)((long)local_60.sh + uVar23 * 4) = 0;
        *(face **)((long)local_60.sh + uVar23 * 4 + 0x30) = local_e8;
        *local_108 = (shellface)((long)local_60.sh + (ulong)(uint)local_60.shver);
        pmVar8 = local_f8->subfaces;
        puVar16[3] = 0;
        *puVar16 = pmVar8->deaditemstack;
        pmVar8->deaditemstack = puVar16;
        pmVar8->items = pmVar8->items + -1;
      }
      else {
        local_d8 = (shellface)(long)((int)uVar28 >> 1);
        puVar7[(long)local_d8 + 6] = 0;
        puVar16[lVar12 + 6] = 0;
        local_70 = (shellface)CONCAT44(local_70._4_4_,uVar24);
        local_78 = puVar7;
        makeshellface(local_f8,local_f8->subfaces,&local_60);
        uVar23 = (ulong)local_60.shver;
        local_60.sh[sorgpivot[uVar23]] = local_e0;
        local_60.sh[sdestpivot[uVar23]] = local_80;
        local_60.sh[sapexpivot[uVar23]] = local_f0;
        *(undefined4 *)((long)local_60.sh + (long)local_f8->shmarkindex * 4) =
             *(undefined4 *)((long)local_78 + (long)local_f8->shmarkindex * 4);
        local_60.sh[(long)(local_60.shver >> 1) + 6] = (shellface)local_e8;
        *local_108 = (shellface)(uVar23 | (ulong)local_60.sh);
        iVar3 = snextpivot[uVar23];
        local_60.sh[iVar3 >> 1] = (shellface)((long)(int)local_70 | (ulong)local_78);
        local_78[(long)local_d8] = (long)iVar3 | (ulong)local_60.sh;
        iVar3 = snextpivot[iVar3];
        local_60.sh[iVar3 >> 1] = (shellface)((long)iVar25 | (ulong)puVar16);
        puVar16[lVar12] = (long)iVar3 | (ulong)local_60.sh;
        puVar1 = (uint *)((long)local_60.sh + (long)local_f8->shmarkindex * 4 + 4);
        *puVar1 = *puVar1 | 2;
      }
      iVar25 = local_60.shver;
      pppdVar17 = local_60.sh;
      this_00 = local_f8;
      arraypool::newindex(local_f8->cavesegshlist,&local_110);
      *local_110 = (shellface)pppdVar17;
      *(int *)(local_110 + 1) = iVar25;
      pppdVar17 = local_110;
      in_R9 = (int *)((long)local_d0 + 1);
    }
    paVar13->objects = 0;
    paVar13 = this_00->cavesegshlist;
    uVar23 = paVar13->objects;
    if (1 < (long)uVar23) {
      uVar18 = 0;
      while (local_110 = pppdVar17, (long)uVar18 < (long)uVar23) {
        bVar2 = (byte)paVar13->log2objectsperblock;
        pcVar6 = paVar13->toparray[(uint)uVar18 >> (bVar2 & 0x1f)];
        lVar12 = (long)(int)((paVar13->objectsperblockmark & (uint)uVar18) * paVar13->objectbytes);
        uVar18 = uVar18 + 1;
        uVar28 = (uint)(uVar18 % uVar23);
        pcVar9 = paVar13->toparray[uVar28 >> (bVar2 & 0x1f)];
        uVar28 = (paVar13->objectsperblockmark & uVar28) * paVar13->objectbytes;
        in_R9 = (int *)(ulong)uVar28;
        pppdVar17 = (shellface *)(pcVar9 + (int)uVar28);
        *(ulong *)(*(long *)(pcVar6 + lVar12) + (long)(*(int *)(pcVar6 + lVar12 + 8) >> 1) * 8) =
             (long)*(int *)(pcVar9 + (long)(int)uVar28 + 8) | *(ulong *)(pcVar9 + (int)uVar28);
        paVar13 = this_00->cavesegshlist;
        uVar23 = paVar13->objects;
      }
    }
    pmVar8 = this_00->subsegs;
    pppdVar17 = local_48->sh;
    pppdVar17[3] = (shellface)0x0;
    *pppdVar17 = (shellface)pmVar8->deaditemstack;
    pmVar8->deaditemstack = pppdVar17;
    pmVar8->items = pmVar8->items + -1;
    pmVar8 = this_00->subsegs;
    local_50[3] = 0;
    *local_50 = pmVar8->deaditemstack;
    pmVar8->deaditemstack = local_50;
    pmVar8->items = pmVar8->items + -1;
    local_48->sh = local_108;
    local_48->shver = local_64;
  }
  ppdVar19 = (shellface)0x0;
  do {
    paVar13 = this_00->cavesegshlist;
    if (paVar13->objects <= (long)ppdVar19) {
      paVar13->objects = 0;
      if (2 < this_00->b->verbose) {
        printf("      Created %ld new subfaces.\n",this_00->caveshbdlist->objects);
      }
      if (local_fc != 0) {
        lawsonflip(this_00);
      }
      return 0;
    }
    pcVar6 = paVar13->toparray[(uint)ppdVar19 >> ((byte)paVar13->log2objectsperblock & 0x1f)];
    lVar12 = (long)paVar13->objectbytes * (long)(int)(paVar13->objectsperblockmark & (uint)ppdVar19)
    ;
    s = (face *)(pcVar6 + lVar12);
    *(int *)(pcVar6 + lVar12 + 8) = snextpivot[*(int *)(pcVar6 + lVar12 + 8)];
    local_80 = ppdVar19;
    spivotself(local_f8,s);
    this_00 = local_f8;
    pppdVar17 = *(shellface **)(pcVar6 + lVar12);
    uVar28 = *(uint *)(pcVar6 + lVar12 + 8);
    pfVar11 = s;
    if (pppdVar17[sorgpivot[(int)uVar28]] == local_f0) {
LAB_00122a0a:
      while( true ) {
        while( true ) {
          local_e8 = pfVar11;
          arraypool::newindex(this_00->caveshlist,&local_110);
          *local_110 = (shellface)pppdVar17;
          *(uint *)(local_110 + 1) = uVar28;
          pppdVar15 = pppdVar17 + (snextpivot[snextpivot[(int)uVar28]] >> 1);
          pppdVar17 = (shellface *)((ulong)*pppdVar15 & 0xfffffffffffffff8);
          if (s->sh == pppdVar17) break;
          uVar28 = (uint)*pppdVar15 & 7;
          uVar28 = pppdVar17[sorgpivot[uVar28]] != local_f0 ^ uVar28;
          s = local_e8;
          pfVar11 = local_e8;
        }
        paVar13 = this_00->caveshlist;
        lVar12 = paVar13->objects;
        if (lVar12 == 3) break;
        pppdVar15 = local_c8.sh;
        pppdVar17 = local_110;
        pppdVar27 = local_b8;
        iVar25 = local_c8.shver;
        uVar28 = local_b0;
        for (lVar26 = 0; s = local_e8, lVar26 < lVar12; lVar26 = lVar26 + 1) {
          pcVar6 = paVar13->toparray[(uint)lVar26 >> ((byte)paVar13->log2objectsperblock & 0x1f)];
          lVar21 = (long)paVar13->objectbytes *
                   (long)(int)(paVar13->objectsperblockmark & (uint)lVar26);
          pppdVar17 = (shellface *)(pcVar6 + lVar21);
          pppdVar15 = *(shellface **)(pcVar6 + lVar21);
          iVar25 = *(int *)(pcVar6 + lVar21 + 8);
          uVar28 = (uint)pppdVar15[iVar25 >> 1] & 7;
          pppdVar27 = (shellface *)((ulong)pppdVar15[iVar25 >> 1] & 0xfffffffffffffff8);
          ppdVar19 = pppdVar15[sorgpivot[iVar25]];
          uVar28 = ppdVar19 != pppdVar27[sdestpivot[uVar28]] ^ uVar28;
          if (((*(byte *)((long)pppdVar15 + (long)this_00->shmarkindex * 4 + 4) & 2) == 0) &&
             ((*(byte *)((long)pppdVar27 + (long)this_00->shmarkindex * 4 + 4) & 2) == 0)) {
            local_e0 = (shellface)CONCAT44(local_e0._4_4_,iVar25);
            local_70 = pppdVar15[sdestpivot[iVar25]];
            local_d0 = (shellface *)pppdVar15[sapexpivot[iVar25]];
            local_d8 = pppdVar27[sapexpivot[uVar28]];
            local_108 = pppdVar17;
            calculateabovepoint4
                      (this_00,(point)ppdVar19,(point)local_70,(point)local_d0,(point)local_d8);
            local_78 = (undefined8 *)
                       orient3d((double *)local_d0,(double *)local_d8,this_00->dummypoint,
                                (double *)ppdVar19);
            dVar29 = orient3d((double *)local_d0,(double *)local_d8,this_00->dummypoint,
                              (double *)local_70);
            if (dVar29 * (double)local_78 < 0.0) {
              local_c8.shver = (int)local_e0;
              local_110 = local_108;
              local_c8.sh = pppdVar15;
              local_b8 = pppdVar27;
              local_b0 = uVar28;
              flip22(this_00,&local_c8,local_fc,0);
              s = local_e8;
              local_e8->sh = local_b8;
              local_e8->shver = snextpivot[snextpivot[(int)local_b0]];
              arraypool::newindex(this_00->caveshbdlist,&local_110);
              *local_110 = (shellface)local_c8.sh;
              *(int *)(local_110 + 1) = local_c8.shver;
              paVar13 = this_00->caveshlist;
              lVar12 = paVar13->objects;
              pppdVar17 = local_110;
              pppdVar15 = local_c8.sh;
              iVar25 = local_c8.shver;
              pppdVar27 = local_b8;
              uVar28 = local_b0;
              break;
            }
            paVar13 = this_00->caveshlist;
            lVar12 = paVar13->objects;
            pppdVar17 = local_108;
            iVar25 = (int)local_e0;
          }
        }
        local_b0 = uVar28;
        local_b8 = pppdVar27;
        local_c8.shver = iVar25;
        local_c8.sh = pppdVar15;
        local_110 = pppdVar17;
        in_R9 = sdestpivot;
        if (lVar12 == lVar26) {
          local_110 = (shellface *)*paVar13->toparray;
          local_c8.sh = (shellface *)*local_110;
          local_c8.shver = *(int *)(local_110 + 1);
          local_b0 = (uint)local_c8.sh[local_c8.shver >> 1] & 7;
          local_b8 = (shellface *)((ulong)local_c8.sh[local_c8.shver >> 1] & 0xfffffffffffffff8);
          if (local_c8.sh[sorgpivot[local_c8.shver]] != local_b8[sdestpivot[local_b0]]) {
            local_b0 = local_b0 ^ 1;
          }
          flip22(this_00,&local_c8,local_fc,0);
          s->sh = local_b8;
          s->shver = snextpivot[snextpivot[(int)local_b0]];
          arraypool::newindex(this_00->caveshbdlist,&local_110);
          *local_110 = (shellface)local_c8.sh;
          *(int *)(local_110 + 1) = local_c8.shver;
          paVar13 = this_00->caveshlist;
        }
        paVar13->objects = 0;
        pppdVar17 = s->sh;
        uVar28 = s->shver;
        pfVar11 = local_e8;
      }
      ppcVar10 = paVar13->toparray;
      iVar25 = paVar13->log2objectsperblock;
      uVar28 = paVar13->objectsperblockmark;
      iVar3 = paVar13->objectbytes;
      piVar22 = &local_c8.shver;
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        pcVar6 = ppcVar10[(uint)lVar12 >> ((byte)iVar25 & 0x1f)];
        lVar26 = (long)(int)((uint)lVar12 & uVar28) * (long)iVar3;
        in_R9 = (int *)(pcVar6 + lVar26);
        ((face *)(piVar22 + -2))->sh = *(shellface **)(pcVar6 + lVar26);
        *piVar22 = *(int *)(pcVar6 + lVar26 + 8);
        piVar22 = piVar22 + 4;
      }
      local_110 = (shellface *)in_R9;
      flip31(this_00,&local_c8,local_fc);
      for (lVar12 = 0; lVar12 != 0x30; lVar12 = lVar12 + 0x10) {
        pmVar8 = this_00->subfaces;
        puVar7 = *(undefined8 **)((long)&local_c8.sh + lVar12);
        puVar7[3] = 0;
        *puVar7 = pmVar8->deaditemstack;
        pmVar8->deaditemstack = puVar7;
        pmVar8->items = pmVar8->items + -1;
      }
      this_00->caveshlist->objects = 0;
      arraypool::newindex(this_00->caveshbdlist,&local_110);
      *local_110 = local_98;
      *(undefined4 *)(local_110 + 1) = local_90;
    }
    else {
      uVar23 = (long)(int)uVar28 ^ 1;
      uVar28 = (uint)uVar23;
      s->shver = uVar28;
      if (pppdVar17[sorgpivot[uVar23]] == local_f0) goto LAB_00122a0a;
    }
    ppdVar19 = (shellface)((long)local_80 + 1);
  } while( true );
}

Assistant:

int tetgenmesh::sremovevertex(point delpt, face* parentsh, face* parentseg,
                              int lawson)
{
  face flipfaces[4], spinsh, *parysh;
  point pa, pb, pc, pd;
  REAL ori1, ori2;
  int it, i, j;

  if (parentseg != NULL) {
    // 'delpt' (p) should be a Steiner point inserted in a segment [a,b],
    //   where 'parentseg' should be [p,b]. Find the segment [a,p].
    face startsh, neighsh, nextsh;
    face abseg, prevseg, checkseg;
    face adjseg1, adjseg2;
    face fakesh;
    senext2(*parentseg, prevseg);
    spivotself(prevseg);
    prevseg.shver = 0;
    // Restore the original segment [a,b].
    pa = sorg(prevseg);
    pb = sdest(*parentseg);
    if (b->verbose > 2) {
      printf("      Remove vertex %d from segment [%d, %d].\n", 
             pointmark(delpt), pointmark(pa), pointmark(pb));
    }
    makeshellface(subsegs, &abseg);
    setshvertices(abseg, pa, pb, NULL);
    setshellmark(abseg, shellmark(*parentseg));
    if (checkconstraints) {
      setareabound(abseg, areabound(*parentseg));
    }
    if (useinsertradius) {
      setfacetindex(abseg, getfacetindex(*parentseg));
    }
    // Connect [#, a]<->[a, b].
    senext2(prevseg, adjseg1);
    spivotself(adjseg1);
    if (adjseg1.sh != NULL) {
      adjseg1.shver = 0;
      senextself(adjseg1);
      senext2(abseg, adjseg2);
      sbond(adjseg1, adjseg2);
    }
    // Connect [a, b]<->[b, #].
    senext(*parentseg, adjseg1);
    spivotself(adjseg1);
    if (adjseg1.sh != NULL) {
      adjseg1.shver = 0;
      senext2self(adjseg1);
      senext(abseg, adjseg2);
      sbond(adjseg1, adjseg2);
    }
    // Update the point-to-segment map.
    setpoint2sh(pa, sencode(abseg));
    setpoint2sh(pb, sencode(abseg));

    // Get the faces in face ring at segment [p, b].
    //   Re-use array 'caveshlist'.
    spivot(*parentseg, *parentsh);
    if (parentsh->sh != NULL) {
      spinsh = *parentsh;
      while (1) {
        // Save this face in list.
        caveshlist->newindex((void **) &parysh);
        *parysh = spinsh;
        // Go to the next face in the ring.
        spivotself(spinsh);
        if (spinsh.sh == NULL) {
          break; // It is possible there is only one facet.
        }
        if (spinsh.sh == parentsh->sh) break;
      }
    }

    // Create the face ring of the new segment [a,b]. Each face in the ring
    //   is [a,b,p] (degenerated!). It will be removed (automatically).
    for (i = 0; i < caveshlist->objects; i++) {
      parysh = (face *) fastlookup(caveshlist, i);
      startsh = *parysh;
      if (sorg(startsh) != delpt) {
        sesymself(startsh);
      }      
      // startsh is [p, b, #1], find the subface [a, p, #2].
      neighsh = startsh;
      while (1) {
        senext2self(neighsh);
        sspivot(neighsh, checkseg);
        if (checkseg.sh != NULL) {
          // It must be the segment [a, p].
          break;
        }
        spivotself(neighsh);
        if (sorg(neighsh) != delpt) sesymself(neighsh);
      }
      // Now neighsh is [a, p, #2].
      if (neighsh.sh != startsh.sh) {
        // Detach the two subsegments [a,p] and [p,b] from subfaces.
        ssdissolve(startsh);
        ssdissolve(neighsh);
        // Create a degenerated subface [a,b,p]. It is used to: (1) hold the
        //   new segment [a,b]; (2) connect to the two adjacent subfaces
        //   [p,b,#] and [a,p,#].
        makeshellface(subfaces, &fakesh);
        setshvertices(fakesh, pa, pb, delpt);
        setshellmark(fakesh, shellmark(startsh));
        // Connect fakesh to the segment [a,b].
        ssbond(fakesh, abseg);
        // Connect fakesh to adjacent subfaces: [p,b,#1] and [a,p,#2].
        senext(fakesh, nextsh);
        sbond(nextsh, startsh);
        senext2(fakesh, nextsh);
        sbond(nextsh, neighsh);
        smarktest(fakesh); // Mark it as faked.
      } else {
        // Special case. There exists already a degenerated face [a,b,p]!
        //   There is no need to create a faked subface here.
        senext2self(neighsh); // [a,b,p]
        // Since we will re-connect the face ring using the faked subfaces.
        //   We put the adjacent face of [a,b,p] to the list.
        spivot(neighsh, startsh); // The original adjacent subface.
        if (sorg(startsh) != pa) sesymself(startsh);
        sdissolve(startsh);
        // Connect fakesh to the segment [a,b].
        ssbond(startsh, abseg);
        fakesh = startsh; // Do not mark it!
        // Delete the degenerated subface.
        shellfacedealloc(subfaces, neighsh.sh);
      }
      // Save the fakesh in list (for re-creating the face ring).
      cavesegshlist->newindex((void **) &parysh);
      *parysh = fakesh;
    } // i
    caveshlist->restart();

    // Re-create the face ring.
    if (cavesegshlist->objects > 1) {
      for (i = 0; i < cavesegshlist->objects; i++) {
        parysh = (face *) fastlookup(cavesegshlist, i);
        fakesh = *parysh;
        // Get the next face in the ring.
        j = (i + 1) % cavesegshlist->objects;
        parysh = (face *) fastlookup(cavesegshlist, j);
        nextsh = *parysh;
        sbond1(fakesh, nextsh);
      }
    }

    // Delete the two subsegments containing p.
    shellfacedealloc(subsegs, parentseg->sh);
    shellfacedealloc(subsegs, prevseg.sh);
    // Return the new segment.
    *parentseg = abseg;
  } else {
    // p is inside the surface.
    if (b->verbose > 2) {
      printf("      Remove vertex %d from surface.\n", pointmark(delpt));
    }
    // Let 'delpt' be its apex.
    senextself(*parentsh);
    // For unifying the code, we add parentsh to list.
    cavesegshlist->newindex((void **) &parysh);
    *parysh = *parentsh;
  }

  // Remove the point (p).

  for (it = 0; it < cavesegshlist->objects; it++) {
    parentsh = (face *) fastlookup(cavesegshlist, it); // [a,b,p]
    senextself(*parentsh); // [b,p,a].
    spivotself(*parentsh);
    if (sorg(*parentsh) != delpt) sesymself(*parentsh);
    // now parentsh is [p,b,#].
    if (sorg(*parentsh) != delpt) {
      // The vertex has already been removed in above special case.
      continue;
    }

    while (1) {      
      // Initialize the flip edge list. Re-use 'caveshlist'.
      spinsh = *parentsh; // [p, b, #]
      while (1) {
        caveshlist->newindex((void **) &parysh);
        *parysh = spinsh;
        senext2self(spinsh);
        spivotself(spinsh);
        if (spinsh.sh == parentsh->sh) break;
        if (sorg(spinsh) != delpt) sesymself(spinsh);
      } // while (1)

      if (caveshlist->objects == 3) {
        // Delete the point by a 3-to-1 flip.
        for (i = 0; i < 3; i++) {
          parysh = (face *) fastlookup(caveshlist, i);
          flipfaces[i] = *parysh;
        }
        flip31(flipfaces, lawson);
        for (i = 0; i < 3; i++) { 
          shellfacedealloc(subfaces, flipfaces[i].sh);
        }
        caveshlist->restart();
        // Save the new subface.
        caveshbdlist->newindex((void **) &parysh);
        *parysh = flipfaces[3];
        // The vertex is removed.
        break;
      }

      // Search an edge to flip.
      for (i = 0; i < caveshlist->objects; i++) {
        parysh = (face *) fastlookup(caveshlist, i);
        flipfaces[0] = *parysh;
        spivot(flipfaces[0], flipfaces[1]);
        if (sorg(flipfaces[0]) != sdest(flipfaces[1])) 
          sesymself(flipfaces[1]);
        // Skip this edge if it belongs to a faked subface.
        if (!smarktested(flipfaces[0]) && !smarktested(flipfaces[1])) {
          pa = sorg(flipfaces[0]);
          pb = sdest(flipfaces[0]);
          pc = sapex(flipfaces[0]);
          pd = sapex(flipfaces[1]);
          calculateabovepoint4(pa, pb, pc, pd);
          // Check if a 2-to-2 flip is possible.
          ori1 = orient3d(pc, pd, dummypoint, pa);
          ori2 = orient3d(pc, pd, dummypoint, pb);
          if (ori1 * ori2 < 0) {
            // A 2-to-2 flip is found.
            flip22(flipfaces, lawson, 0);
            // The i-th edge is flipped. The i-th and (i-1)-th subfaces are
            //   changed. The 'flipfaces[1]' contains p as its apex.
            senext2(flipfaces[1], *parentsh);
            // Save the new subface.
            caveshbdlist->newindex((void **) &parysh);
            *parysh = flipfaces[0];
            break;
          }
        } //
      } // i

      if (i == caveshlist->objects) {
        // Do a flip22 and a flip31 to remove p.
        parysh = (face *) fastlookup(caveshlist, 0);
        flipfaces[0] = *parysh;
        spivot(flipfaces[0], flipfaces[1]);
        if (sorg(flipfaces[0]) != sdest(flipfaces[1])) {
          sesymself(flipfaces[1]);
        }
        flip22(flipfaces, lawson, 0);
        senext2(flipfaces[1], *parentsh);
        // Save the new subface.
        caveshbdlist->newindex((void **) &parysh);
        *parysh = flipfaces[0];
      }

      // The edge list at p are changed.
      caveshlist->restart();
    } // while (1)

  } // it

  cavesegshlist->restart();

  if (b->verbose > 2) {
    printf("      Created %ld new subfaces.\n", caveshbdlist->objects);
  }


  if (lawson) {
    lawsonflip();
  }

  return 0;
}